

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase285::TestCase285(TestCase285 *this)

{
  TestCase285 *this_local;
  
  TestCase::TestCase(&this->super_TestCase,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/arena-test.c++"
                     ,0x11d,"legacy test: Arena/Strings");
  (this->super_TestCase)._vptr_TestCase = (_func_int **)&PTR_run_00bfe290;
  return;
}

Assistant:

TEST(Arena, Strings) {
  Arena arena;

  StringPtr foo = arena.copyString("foo");
  StringPtr bar = arena.copyString("bar");
  StringPtr quux = arena.copyString("quux");
  StringPtr corge = arena.copyString("corge");

  EXPECT_EQ("foo", foo);
  EXPECT_EQ("bar", bar);
  EXPECT_EQ("quux", quux);
  EXPECT_EQ("corge", corge);

  EXPECT_EQ(foo.end() + 1, bar.begin());
  EXPECT_EQ(bar.end() + 1, quux.begin());
  EXPECT_EQ(quux.end() + 1, corge.begin());
}